

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O2

EVP_PKEY_CTX * EVP_PKEY_CTX_new(EVP_PKEY *pkey,ENGINE *e)

{
  EVP_PKEY_METHOD *pmeth;
  EVP_PKEY_CTX *pEVar1;
  
  if ((pkey == (EVP_PKEY *)0x0) || (pkey->ameth == (EVP_PKEY_ASN1_METHOD *)0x0)) {
    ERR_put_error(6,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x48);
  }
  else {
    pmeth = *(EVP_PKEY_METHOD **)(pkey->ameth + 0x10);
    if (pmeth != (EVP_PKEY_METHOD *)0x0) {
      pEVar1 = evp_pkey_ctx_new((EVP_PKEY *)pkey,(ENGINE *)e,pmeth);
      return (EVP_PKEY_CTX *)pEVar1;
    }
    ERR_put_error(6,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x4e);
    ERR_add_error_dataf("algorithm %d",(ulong)*(uint *)pkey->ameth);
  }
  return (EVP_PKEY_CTX *)0x0;
}

Assistant:

EVP_PKEY_CTX *EVP_PKEY_CTX_new(EVP_PKEY *pkey, ENGINE *e) {
  if (pkey == NULL || pkey->ameth == NULL) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_PASSED_NULL_PARAMETER);
    return NULL;
  }

  const EVP_PKEY_METHOD *pkey_method = pkey->ameth->pkey_method;
  if (pkey_method == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    ERR_add_error_dataf("algorithm %d", pkey->ameth->pkey_id);
    return NULL;
  }

  return evp_pkey_ctx_new(pkey, e, pkey_method);
}